

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void __thiscall benchmark::internal::BenchmarkImp::~BenchmarkImp(BenchmarkImp *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->thread_counts_).super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->args_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

BenchmarkImp::~BenchmarkImp() {
}